

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O0

void __thiscall
kj::DestructorOnlyArrayDisposer::disposeImpl
          (DestructorOnlyArrayDisposer *this,void *firstElement,size_t elementSize,
          size_t elementCount,size_t capacity,_func_void_void_ptr *destroyElement)

{
  undefined1 local_58 [8];
  ExceptionSafeArrayUtil guard;
  _func_void_void_ptr *destroyElement_local;
  size_t capacity_local;
  size_t elementCount_local;
  size_t elementSize_local;
  void *firstElement_local;
  DestructorOnlyArrayDisposer *this_local;
  
  if (destroyElement != (_func_void_void_ptr *)0x0) {
    guard.destroyElement = destroyElement;
    ExceptionSafeArrayUtil::ExceptionSafeArrayUtil
              ((ExceptionSafeArrayUtil *)local_58,firstElement,elementSize,elementCount,
               destroyElement);
    ExceptionSafeArrayUtil::destroyAll((ExceptionSafeArrayUtil *)local_58);
    ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil((ExceptionSafeArrayUtil *)local_58);
  }
  return;
}

Assistant:

void DestructorOnlyArrayDisposer::disposeImpl(
    void* firstElement, size_t elementSize, size_t elementCount,
    size_t capacity, void (*destroyElement)(void*)) const {
  if (destroyElement != nullptr) {
    ExceptionSafeArrayUtil guard(firstElement, elementSize, elementCount, destroyElement);
    guard.destroyAll();
  }
}